

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 sqlite3VdbeSerialType(Mem *pMem,int file_format,u32 *pLen)

{
  ushort uVar1;
  char *pcVar2;
  char *local_40;
  u64 u;
  i64 i;
  u32 n;
  int flags;
  u32 *pLen_local;
  int file_format_local;
  Mem *pMem_local;
  
  uVar1 = pMem->flags;
  if ((uVar1 & 1) == 0) {
    if ((uVar1 & 4) == 0) {
      if ((uVar1 & 8) == 0) {
        i._0_4_ = pMem->n;
        if ((uVar1 & 0x4000) != 0) {
          i._0_4_ = (pMem->u).nZero + (u32)i;
        }
        *pLen = (u32)i;
        pMem_local._4_4_ = (u32)i * 2 + 0xc + (uint)((uVar1 & 2) != 0);
      }
      else {
        *pLen = 8;
        pMem_local._4_4_ = 7;
      }
    }
    else {
      pcVar2 = (pMem->u).zPType;
      local_40 = pcVar2;
      if ((long)pcVar2 < 0) {
        local_40 = (char *)((ulong)pcVar2 ^ 0xffffffffffffffff);
      }
      if (local_40 < (char *)0x80) {
        if (((char *)((ulong)pcVar2 & 1) == pcVar2) && (3 < file_format)) {
          *pLen = 0;
          pMem_local._4_4_ = (int)local_40 + 8;
        }
        else {
          *pLen = 1;
          pMem_local._4_4_ = 1;
        }
      }
      else if (local_40 < (char *)0x8000) {
        *pLen = 2;
        pMem_local._4_4_ = 2;
      }
      else if (local_40 < (char *)0x800000) {
        *pLen = 3;
        pMem_local._4_4_ = 3;
      }
      else if (local_40 < (char *)0x80000000) {
        *pLen = 4;
        pMem_local._4_4_ = 4;
      }
      else if (local_40 < (char *)0x800000000000) {
        *pLen = 6;
        pMem_local._4_4_ = 5;
      }
      else {
        *pLen = 8;
        pMem_local._4_4_ = 6;
      }
    }
  }
  else {
    *pLen = 0;
    pMem_local._4_4_ = 0;
  }
  return pMem_local._4_4_;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3VdbeSerialType(Mem *pMem, int file_format, u32 *pLen){
  int flags = pMem->flags;
  u32 n;

  assert( pLen!=0 );
  if( flags&MEM_Null ){
    *pLen = 0;
    return 0;
  }
  if( flags&MEM_Int ){
    /* Figure out whether to use 1, 2, 4, 6 or 8 bytes. */
#   define MAX_6BYTE ((((i64)0x00008000)<<32)-1)
    i64 i = pMem->u.i;
    u64 u;
    if( i<0 ){
      u = ~i;
    }else{
      u = i;
    }
    if( u<=127 ){
      if( (i&1)==i && file_format>=4 ){
        *pLen = 0;
        return 8+(u32)u;
      }else{
        *pLen = 1;
        return 1;
      }
    }
    if( u<=32767 ){ *pLen = 2; return 2; }
    if( u<=8388607 ){ *pLen = 3; return 3; }
    if( u<=2147483647 ){ *pLen = 4; return 4; }
    if( u<=MAX_6BYTE ){ *pLen = 6; return 5; }
    *pLen = 8;
    return 6;
  }
  if( flags&MEM_Real ){
    *pLen = 8;
    return 7;
  }
  assert( pMem->db->mallocFailed || flags&(MEM_Str|MEM_Blob) );
  assert( pMem->n>=0 );
  n = (u32)pMem->n;
  if( flags & MEM_Zero ){
    n += pMem->u.nZero;
  }
  *pLen = n;
  return ((n*2) + 12 + ((flags&MEM_Str)!=0));
}